

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackSTGZGenerator.cxx
# Opt level: O1

int __thiscall cmCPackSTGZGenerator::PackageFiles(cmCPackSTGZGenerator *this)

{
  pointer pbVar1;
  int iVar2;
  uint uVar3;
  Status SVar4;
  byte bVar5;
  string *pfn;
  pointer pbVar6;
  
  iVar2 = cmCPackArchiveGenerator::PackageFiles(&this->super_cmCPackArchiveGenerator);
  if (iVar2 == 0) {
    uVar3 = 0;
  }
  else {
    pbVar6 = (this->super_cmCPackArchiveGenerator).super_cmCPackGenerator.packageFileNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->super_cmCPackArchiveGenerator).super_cmCPackGenerator.packageFileNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar6 == pbVar1) {
      uVar3 = 1;
    }
    else {
      bVar5 = 1;
      do {
        SVar4 = cmsys::SystemTools::SetPermissions((pbVar6->_M_dataplus)._M_p,0x1ff,false);
        bVar5 = bVar5 & SVar4.Kind_ == Success;
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != pbVar1);
      uVar3 = (uint)bVar5;
    }
  }
  return uVar3;
}

Assistant:

int cmCPackSTGZGenerator::PackageFiles()
{
  bool retval = true;
  if (!this->Superclass::PackageFiles()) {
    return 0;
  }

  /* TGZ generator (our Superclass) may
   * have generated several packages (component packaging)
   * so we must iterate over generated packages.
   */
  for (std::string const& pfn : this->packageFileNames) {
    retval &= static_cast<bool>(
      cmSystemTools::SetPermissions(pfn.c_str(),
#if defined(_MSC_VER) || defined(__MINGW32__)
                                    S_IREAD | S_IWRITE | S_IEXEC
#else
                                    S_IRUSR | S_IWUSR | S_IXUSR | S_IRGRP |
                                      S_IWGRP | S_IXGRP | S_IROTH | S_IWOTH |
                                      S_IXOTH
#endif
                                    ));
  }
  return retval;
}